

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_key(nk_text_edit *state,nk_keys key,int shift_mod,nk_user_font *font,
                    float row_height)

{
  int temp;
  int iVar1;
  int iVar2;
  char *pcVar3;
  nk_text_find *pnVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  int len;
  nk_text_edit_row row;
  nk_text_find find;
  nk_rune local_74;
  float local_70;
  float local_6c;
  int local_68;
  nk_rune local_64;
  nk_text_edit_row local_60;
  nk_text_find local_48;
  
LAB_0013b99b:
  switch(key) {
  case NK_KEY_DEL:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start == state->select_end) {
      if (state->cursor < (state->string).len) {
        nk_textedit_delete(state,state->cursor,1);
      }
    }
    else {
LAB_0013bd2e:
      nk_textedit_delete_selection(state);
    }
LAB_0013c311:
    state->has_preferred_x = '\0';
    return;
  default:
    goto switchD_0013b9ae_caseD_4;
  case NK_KEY_BACKSPACE:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start != state->select_end) goto LAB_0013bd2e;
    nk_textedit_clamp(state);
    if (0 < state->cursor) {
      nk_textedit_delete(state,state->cursor + -1,1);
      state->cursor = state->cursor + -1;
    }
    goto LAB_0013c311;
  case NK_KEY_UP:
    if (state->single_line == '\0') {
      iVar1 = state->select_start;
      iVar5 = state->select_end;
      if (shift_mod == 0) {
        if (iVar1 != iVar5) {
          if (iVar5 < iVar1) {
            state->select_start = iVar5;
            iVar1 = iVar5;
          }
          state->cursor = iVar1;
          state->select_end = iVar1;
          state->has_preferred_x = '\0';
        }
      }
      else if (iVar1 == iVar5) {
        state->select_end = state->cursor;
        state->select_start = state->cursor;
      }
      else {
        state->cursor = iVar5;
      }
      nk_textedit_clamp(state);
      nk_textedit_find_charpos
                (&local_48,state,state->cursor,(uint)state->single_line,font,row_height);
      if (local_48.prev_first == local_48.first_char) {
        return;
      }
      pnVar4 = (nk_text_find *)&state->preferred_x;
      if (state->has_preferred_x == '\0') {
        pnVar4 = &local_48;
      }
      local_70 = pnVar4->x;
      state->cursor = local_48.prev_first;
      nk_textedit_layout_row(&local_60,state,local_48.prev_first,row_height,font);
      local_68 = local_60.num_chars;
      if ((local_60.num_chars < 1) || (local_6c = local_60.x1, local_60.x1 <= local_60.x0))
      goto LAB_0013c1f7;
      iVar1 = 1;
      fVar9 = local_60.x0;
      goto LAB_0013c195;
    }
    key = NK_KEY_LEFT;
    goto LAB_0013b99b;
  case NK_KEY_DOWN:
    if (state->single_line != '\0') goto code_r0x0013b9d1;
    iVar1 = state->select_end;
    if (shift_mod == 0) {
      if (state->select_start != iVar1) {
        nk_textedit_move_to_last(state);
      }
    }
    else if (state->select_start == iVar1) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    else {
      state->cursor = iVar1;
    }
    nk_textedit_clamp(state);
    nk_textedit_find_charpos(&local_48,state,state->cursor,(uint)state->single_line,font,row_height)
    ;
    if (local_48.length == 0) {
      return;
    }
    pnVar4 = (nk_text_find *)&state->preferred_x;
    if (state->has_preferred_x == '\0') {
      pnVar4 = &local_48;
    }
    local_70 = pnVar4->x;
    iVar1 = local_48.length + local_48.first_char;
    state->cursor = iVar1;
    nk_textedit_layout_row(&local_60,state,iVar1,row_height,font);
    local_68 = local_60.num_chars;
    if ((local_60.num_chars < 1) || (local_6c = local_60.x1, local_60.x1 <= local_60.x0))
    goto LAB_0013c1f7;
    iVar5 = 1;
    fVar9 = local_60.x0;
    goto LAB_0013c073;
  case NK_KEY_LEFT:
    if (shift_mod == 0) {
      iVar5 = state->select_start;
      iVar1 = state->select_end;
      bVar7 = SBORROW4(iVar5,iVar1);
      iVar2 = iVar5 - iVar1;
      bVar6 = iVar5 == iVar1;
      if (!bVar6) goto LAB_0013bddf;
      if (state->cursor < 1) goto LAB_0013c311;
      local_48.first_char = state->cursor + -1;
    }
    else {
      nk_textedit_clamp(state);
      local_48.first_char = state->select_end;
      if (state->select_start == local_48.first_char) {
        local_48.first_char = state->cursor;
        state->select_end = local_48.first_char;
        state->select_start = local_48.first_char;
      }
      if (0 < local_48.first_char) {
        local_48.first_char = local_48.first_char + -1;
        goto LAB_0013bf8d;
      }
    }
    break;
  case NK_KEY_RIGHT:
    iVar1 = state->select_end;
    if (shift_mod == 0) {
      if (state->select_start == iVar1) {
        state->cursor = state->cursor + 1;
      }
      else {
        nk_textedit_move_to_last(state);
      }
      nk_textedit_clamp(state);
      goto LAB_0013c311;
    }
    if (state->select_start == iVar1) {
      iVar1 = state->cursor;
      state->select_start = iVar1;
    }
    else {
      state->cursor = iVar1;
    }
    state->select_end = iVar1 + 1;
    nk_textedit_clamp(state);
    local_48.first_char = state->select_end;
    break;
  case NK_KEY_TEXT_INSERT_MODE:
    if (state->mode != '\0') {
      return;
    }
    state->mode = '\x01';
    return;
  case NK_KEY_TEXT_REPLACE_MODE:
    if (state->mode != '\0') {
      return;
    }
    state->mode = '\x02';
    return;
  case NK_KEY_TEXT_RESET_MODE:
    if (1 < (byte)(state->mode - 1)) {
      return;
    }
    state->mode = '\0';
    return;
  case NK_KEY_TEXT_LINE_START:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      iVar1 = state->select_end;
      if (state->select_start == iVar1) {
        iVar1 = state->cursor;
        state->select_end = iVar1;
        state->select_start = iVar1;
      }
      else {
        state->cursor = iVar1;
      }
      iVar5 = (state->string).len;
      if (iVar1 == iVar5 && iVar5 != 0) {
        iVar1 = iVar1 + -1;
        state->cursor = iVar1;
      }
      nk_textedit_find_charpos(&local_48,state,iVar1,(uint)state->single_line,font,row_height);
      goto LAB_0013bf8d;
    }
    iVar1 = (state->string).len;
    if ((iVar1 != 0) && (state->cursor == iVar1)) {
      state->cursor = iVar1 + -1;
    }
    nk_textedit_clamp(state);
    iVar5 = state->select_start;
    iVar1 = state->select_end;
    if (iVar5 == iVar1) {
      iVar5 = state->cursor;
    }
    else {
      if (iVar1 < iVar5) {
        state->select_start = iVar1;
        iVar5 = iVar1;
      }
      state->cursor = iVar5;
      state->select_end = iVar5;
      state->has_preferred_x = '\0';
    }
    nk_textedit_find_charpos(&local_48,state,iVar5,(uint)state->single_line,font,row_height);
    break;
  case NK_KEY_TEXT_LINE_END:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      iVar1 = state->select_end;
      if (state->select_start == iVar1) {
        iVar1 = state->cursor;
        state->select_end = iVar1;
        state->select_start = iVar1;
      }
      else {
        state->cursor = iVar1;
      }
      nk_textedit_find_charpos(&local_48,state,iVar1,(uint)state->single_line,font,row_height);
      state->has_preferred_x = '\0';
      local_48.first_char = local_48.first_char + local_48.length;
      state->cursor = local_48.first_char;
      if (0 < local_48.length) {
        local_74 = 0;
        nk_str_at_const(&state->string,local_48.first_char + -1,&local_74,(int *)&local_60);
        local_48.first_char = state->cursor;
        if (local_74 == 10) {
          local_48.first_char = local_48.first_char + -1;
          state->cursor = local_48.first_char;
        }
      }
      state->select_end = local_48.first_char;
      return;
    }
    nk_textedit_clamp(state);
    iVar5 = state->select_start;
    iVar1 = state->select_end;
    if (iVar5 == iVar1) {
      iVar5 = state->cursor;
    }
    else {
      if (iVar1 < iVar5) {
        state->select_start = iVar1;
        iVar5 = iVar1;
      }
      state->cursor = iVar5;
      state->select_end = iVar5;
      state->has_preferred_x = '\0';
    }
    nk_textedit_find_charpos(&local_48,state,iVar5,(uint)state->single_line,font,row_height);
    state->has_preferred_x = '\0';
    state->cursor = local_48.first_char + local_48.length;
    if (local_48.length < 1) {
      return;
    }
    local_74 = 0;
    nk_str_at_const(&state->string,local_48.first_char + local_48.length + -1,&local_74,
                    (int *)&local_60);
    if (local_74 != 10) {
      return;
    }
    state->cursor = state->cursor + -1;
    return;
  case NK_KEY_TEXT_START:
    if (shift_mod != 0) {
      if (state->select_start == state->select_end) {
        state->select_start = state->cursor;
      }
      local_48.first_char = 0;
      goto LAB_0013bf8d;
    }
    state->select_end = 0;
    state->cursor = 0;
    state->select_start = 0;
    goto LAB_0013c311;
  case NK_KEY_TEXT_END:
    if (shift_mod == 0) {
      state->cursor = (state->string).len;
      state->select_start = 0;
      state->select_end = 0;
      goto LAB_0013c311;
    }
    if (state->select_start == state->select_end) {
      state->select_start = state->cursor;
    }
    local_48.first_char = (state->string).len;
LAB_0013bf8d:
    state->select_end = local_48.first_char;
    break;
  case NK_KEY_TEXT_UNDO:
    nk_textedit_undo(state);
    goto LAB_0013c311;
  case NK_KEY_TEXT_REDO:
    nk_textedit_redo(state);
    goto LAB_0013c311;
  case NK_KEY_TEXT_SELECT_ALL:
    if (state == (nk_text_edit *)0x0) {
      __assert_fail("state",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x58b3,"void nk_textedit_select_all(struct nk_text_edit *)");
    }
    state->select_start = 0;
    iVar5 = (state->string).len;
    goto LAB_0013bdef;
  case NK_KEY_TEXT_WORD_LEFT:
    iVar5 = state->select_start;
    iVar1 = state->select_end;
    if (shift_mod != 0) {
      iVar2 = state->cursor;
      if (iVar5 == iVar1) {
        state->select_end = iVar2;
        state->select_start = iVar2;
      }
      goto LAB_0013ba8e;
    }
    bVar7 = SBORROW4(iVar5,iVar1);
    iVar2 = iVar5 - iVar1;
    bVar6 = iVar5 == iVar1;
    if (bVar6) {
      iVar1 = state->cursor;
      goto LAB_0013bd6e;
    }
LAB_0013bddf:
    if (!bVar6 && bVar7 == iVar2 < 0) {
      state->select_start = iVar1;
      iVar5 = iVar1;
    }
    state->cursor = iVar5;
LAB_0013bdef:
    state->select_end = iVar5;
    goto LAB_0013c311;
  case NK_KEY_TEXT_WORD_RIGHT:
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_last(state);
        return;
      }
      iVar1 = nk_textedit_move_to_word_next(state);
      goto LAB_0013bd9e;
    }
    if (state->select_start == state->select_end) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    iVar1 = nk_textedit_move_to_word_next(state);
    goto LAB_0013bb93;
  }
  state->cursor = local_48.first_char;
  goto LAB_0013c311;
  while (iVar1 = nk_is_word_boundary(state,iVar5), iVar2 = iVar5, iVar1 == 0) {
LAB_0013ba8e:
    iVar5 = iVar2 + -1;
    if (iVar2 < 1) break;
  }
  iVar1 = 0;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
LAB_0013bb93:
  state->cursor = iVar1;
  state->select_end = iVar1;
  goto LAB_0013bda4;
code_r0x0013b9d1:
  key = NK_KEY_RIGHT;
  goto LAB_0013b99b;
  while (iVar5 = iVar5 + 1, fVar9 < local_6c) {
LAB_0013c073:
    local_74 = 0;
    local_64 = 0;
    pcVar3 = nk_str_at_const(&state->string,iVar1 + iVar5 + -1,&local_64,(int *)&local_74);
    fVar8 = (*font->width)(font->userdata,font->height,pcVar3,local_74);
    fVar9 = fVar8 + fVar9;
    if ((local_70 < fVar9) || (state->cursor = state->cursor + 1, local_68 <= iVar5)) break;
  }
  goto LAB_0013c1f7;
  while (iVar2 = nk_is_word_boundary(state,iVar5), iVar1 = iVar5, iVar2 == 0) {
LAB_0013bd6e:
    iVar5 = iVar1 + -1;
    if (iVar1 < 1) break;
  }
  iVar1 = 0;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
LAB_0013bd9e:
  state->cursor = iVar1;
LAB_0013bda4:
  nk_textedit_clamp(state);
  return;
  while (iVar1 = iVar1 + 1, fVar9 < local_6c) {
LAB_0013c195:
    local_74 = 0;
    local_64 = 0;
    pcVar3 = nk_str_at_const(&state->string,local_48.prev_first + iVar1 + -1,&local_64,
                             (int *)&local_74);
    fVar8 = (*font->width)(font->userdata,font->height,pcVar3,local_74);
    fVar9 = fVar8 + fVar9;
    if ((local_70 < fVar9) || (state->cursor = state->cursor + 1, local_68 <= iVar1)) break;
  }
LAB_0013c1f7:
  nk_textedit_clamp(state);
  state->has_preferred_x = '\x01';
  state->preferred_x = local_70;
  if (shift_mod != 0) {
    state->select_end = state->cursor;
  }
switchD_0013b9ae_caseD_4:
  return;
}

Assistant:

NK_LIB void
nk_textedit_key(struct nk_text_edit *state, enum nk_keys key, int shift_mod,
    const struct nk_user_font *font, float row_height)
{
retry:
    switch (key)
    {
    case NK_KEY_NONE:
    case NK_KEY_CTRL:
    case NK_KEY_ENTER:
    case NK_KEY_SHIFT:
    case NK_KEY_TAB:
    case NK_KEY_COPY:
    case NK_KEY_CUT:
    case NK_KEY_PASTE:
    case NK_KEY_MAX:
    default: break;
    case NK_KEY_TEXT_UNDO:
         nk_textedit_undo(state);
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_REDO:
        nk_textedit_redo(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_SELECT_ALL:
        nk_textedit_select_all(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_INSERT_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_INSERT;
        break;
    case NK_KEY_TEXT_REPLACE_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_REPLACE;
        break;
    case NK_KEY_TEXT_RESET_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_INSERT ||
            state->mode == NK_TEXT_EDIT_MODE_REPLACE)
            state->mode = NK_TEXT_EDIT_MODE_VIEW;
        break;

    case NK_KEY_LEFT:
        if (shift_mod) {
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection left */
            if (state->select_end > 0)
                --state->select_end;
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to start of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else if (state->cursor > 0)
               --state->cursor;
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_RIGHT:
        if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection right */
            ++state->select_end;
            nk_textedit_clamp(state);
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to end of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else ++state->cursor;
            nk_textedit_clamp(state);
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_TEXT_WORD_LEFT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_previous(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state );
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else {
                state->cursor = nk_textedit_move_to_word_previous(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_TEXT_WORD_RIGHT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
                nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_next(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state);
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else {
                state->cursor = nk_textedit_move_to_word_next(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_DOWN: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down in single-line behave like left&right */
            key = NK_KEY_RIGHT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_last(state);

        /* compute current position of cursor point */
        nk_textedit_clamp(state);
        nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
            font, row_height);

        /* now find character position down a row */
        if (find.length)
        {
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            state->cursor = start;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, start, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel)
                state->select_end = state->cursor;
        }
    } break;

    case NK_KEY_UP: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down become left&right */
            key = NK_KEY_LEFT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_first(state);

         /* compute current position of cursor point */
         nk_textedit_clamp(state);
         nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

         /* can only go up if there's a previous row */
         if (find.prev_first != find.first_char) {
            /* now find character position up a row */
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            state->cursor = find.prev_first;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, find.prev_first, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel) state->select_end = state->cursor;
         }
      } break;

    case NK_KEY_DEL:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            int n = state->string.len;
            if (state->cursor < n)
                nk_textedit_delete(state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_BACKSPACE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            nk_textedit_clamp(state);
            if (state->cursor > 0) {
                nk_textedit_delete(state, state->cursor-1, 1);
                --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_START:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = 0;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_END:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = state->string.len;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->string.len;
            state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_LINE_START: {
        if (shift_mod) {
            struct nk_text_find find;
           nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_find_charpos(&find, state,state->cursor, state->single_line,
                font, row_height);
            state->cursor = state->select_end = find.first_char;
            state->has_preferred_x = 0;
        } else {
            struct nk_text_find find;
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->cursor = find.first_char;
            state->has_preferred_x = 0;
        }
      } break;

    case NK_KEY_TEXT_LINE_END: {
        if (shift_mod) {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
            state->select_end = state->cursor;
        } else {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
        }} break;
    }
}